

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall
CLI::ConversionError::ConversionError
          (ConversionError *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *results)

{
  string *in_RCX;
  allocator<char> local_d1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *results_local;
  string *name_local;
  ConversionError *this_local;
  
  local_20 = results;
  results_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)name;
  name_local = (string *)this;
  ::std::operator+(&local_80,"Could not convert: ",name);
  ::std::operator+(&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
                   " = ");
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,",",&local_d1);
  detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_b0,(detail *)results,&local_d0,in_RCX);
  ::std::operator+(&local_40,&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0);
  ConversionError(this,(string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::allocator<char>::~allocator(&local_d1);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

ConversionError(std::string name, std::vector<std::string> results)
        : ConversionError("Could not convert: " + name + " = " + detail::join(results)) {}